

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall ON_BinaryArchive::ON_BinaryArchive(ON_BinaryArchive *this,archive_mode mode)

{
  endian eVar1;
  archive_mode mode_local;
  ON_BinaryArchive *this_local;
  
  this->_vptr_ON_BinaryArchive = (_func_int **)&PTR__ON_BinaryArchive_00b69b60;
  this->m_3dm_version = 0;
  this->m_3dm_v1_layer_index = 0;
  this->m_3dm_v1_material_index = 0;
  this->m_3dm_opennurbs_version = 0;
  this->m_archive_runtime_environment = Unset;
  this->m_3dm_start_section_offset = 0;
  this->m_3dm_previous_table = Unset;
  this->m_3dm_active_table = Unset;
  this->m_3dm_first_failed_table = Unset;
  this->m_user_data_depth = 0;
  this->m_3dm_table_status_list = (ON_3dmTableStatusLink *)0x0;
  this->m_current_positionX = 0;
  this->m_crc_error_count = 0;
  this->m_critical_error_count = 0;
  this->m_storage_device_error = 0;
  this->m_error_message_mask = 0;
  this->m_3dm_end_mark_length = 0;
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::ON_SimpleArray(&this->m_chunk);
  this->m_bDoChunkCRC = false;
  this->m_bChunkBoundaryCheck = false;
  this->m_compressor = (ON_CompressorImplementation *)0x0;
  eVar1 = ON::Endian();
  this->m_endian = eVar1;
  this->m_mode = mode;
  ON_SimpleArray<ON_UserDataItemFilter>::ON_SimpleArray(&this->m_user_data_filter);
  this->m_save_3dm_render_mesh_flags = 0xffffffff;
  this->m_save_3dm_analysis_mesh_flags = 0xffffffff;
  this->m_bSave3dmPreviewImage = true;
  this->m_bUseBufferCompression = true;
  this->m_bReservedA = false;
  this->m_bReservedB = false;
  this->m_bReservedC = false;
  this->m_bReservedD = false;
  this->m_bReservedE = false;
  this->m_bReservedF = false;
  ON_ComponentManifest::ON_ComponentManifest(&this->m_manifest);
  ON_ManifestMap::ON_ManifestMap(&this->m_manifest_map);
  this->m_bReferencedComponentIndexMapping = true;
  this->m_bReferencedComponentIdMapping = true;
  ON_wString::ON_wString(&this->m_archive_file_name);
  ON_wString::ON_wString(&this->m_archive_directory_name);
  ON_wString::ON_wString(&this->m_archive_full_path);
  ON_wString::ON_wString(&this->m_archive_saved_as_full_path);
  this->m_b3dmArchiveMoved = false;
  this->m_SetModelComponentSerialNumbers = false;
  this->m_bCheckForRemappedIds = false;
  this->m_IntentionallyWriteCorrupt3dmStartSection = '\0';
  this->m_reservedB = false;
  this->m_model_serial_number = 0;
  this->m_reference_model_serial_number = 0;
  this->m_instance_definition_model_serial_number = 0;
  this->m_reserved1 = 0;
  this->m_reserved2 = 0;
  ON_SimpleArray<ON_UUID_struct>::ON_SimpleArray(&this->m_V3_plugin_id_list);
  this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
  ON_3dmAnnotationContext::ON_3dmAnnotationContext(&this->m_annotation_context);
  ON_SimpleArray<ON_TextStyle_*>::ON_SimpleArray(&this->m_archive_text_style_table);
  ON_SimpleArray<ON_2dex>::ON_SimpleArray(&this->m_text_style_to_dim_style_archive_index_map);
  ON_SimpleArray<ON_DimStyle_*>::ON_SimpleArray(&this->m_archive_dim_style_table);
  ON_SimpleArray<ON_DimStyle_*>::ON_SimpleArray(&this->m_DELETE_ME_archive_dim_style_overrides);
  this->m_bLegacyOverrideDimStylesInArchive = false;
  this->m_archive_current_dim_style = (ON_DimStyle *)0x0;
  this->m_archive_dim_style_table_status = 0;
  this->m_archive_dim_style_table_read_index = 0xffffffff;
  ON_String::ON_String(&this->m_archive_3dm_start_section_comment,&ON_String::EmptyString);
  this->m_archive_3dm_properties = (ON_3dmProperties *)0x0;
  this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
  if ((mode == read3dm) || (mode == write3dm)) {
    this->m_bChunkBoundaryCheck = true;
  }
  ON_3dmAnnotationContext::SetReferencedBinaryArchive(&this->m_annotation_context,this);
  return;
}

Assistant:

ON_BinaryArchive::ON_BinaryArchive( ON::archive_mode mode )
  : m_mode(mode)
{
  if (ON::archive_mode::read3dm == mode || ON::archive_mode::write3dm == mode)
    m_bChunkBoundaryCheck = true;
  m_annotation_context.SetReferencedBinaryArchive(this);
}